

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_fxtype_params.cpp
# Opt level: O0

void __thiscall sc_dt::sc_fxtype_params::dump(sc_fxtype_params *this,ostream *os)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RSI;
  int *in_RDI;
  sc_o_mode in_stack_0000002c;
  ostream *in_stack_00000030;
  
  poVar1 = std::operator<<(in_RSI,"sc_fxtype_params");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"(");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"wl     = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*in_RDI);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"iwl    = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[1]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"q_mode = ");
  poVar1 = sc_dt::operator<<(in_stack_00000030,in_stack_0000002c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"o_mode = ");
  poVar1 = sc_dt::operator<<(in_stack_00000030,in_stack_0000002c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"n_bits = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[4]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
sc_fxtype_params::dump( ::std::ostream& os ) const
{
    os << "sc_fxtype_params" << ::std::endl;
    os << "(" << ::std::endl;
    os << "wl     = " << m_wl << ::std::endl;
    os << "iwl    = " << m_iwl << ::std::endl;
    os << "q_mode = " << m_q_mode << ::std::endl;
    os << "o_mode = " << m_o_mode << ::std::endl;
    os << "n_bits = " << m_n_bits << ::std::endl;
    os << ")" << ::std::endl;
}